

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O0

void __thiscall tonk::gateway::SSDPRequester::PollLANInfo(SSDPRequester *this)

{
  bool bVar1;
  undefined1 uVar2;
  SSDPRequester *in_RDI;
  address multicastIP;
  error_code ec;
  Result lanResult;
  bool updated;
  LogStringBuffer buffer;
  LogStringBuffer buffer_1;
  undefined7 in_stack_fffffffffffff818;
  undefined1 in_stack_fffffffffffff81f;
  LogStringBuffer *in_stack_fffffffffffff820;
  address *in_stack_fffffffffffff828;
  address *__args;
  undefined7 in_stack_fffffffffffff830;
  error_code *in_stack_fffffffffffff840;
  OutputWorker *in_stack_fffffffffffff848;
  LogStringBuffer *in_stack_fffffffffffff858;
  LogStringBuffer *buffer_00;
  OutputWorker *in_stack_fffffffffffff860;
  LogStringBuffer *pLVar3;
  LogStringBuffer *this_00;
  bool *in_stack_fffffffffffff890;
  LANInfo *in_stack_fffffffffffff898;
  StateMachine *in_stack_fffffffffffff8b0;
  StateMachine *pSVar4;
  undefined1 local_710 [48];
  string local_6e0 [36];
  undefined4 local_6bc;
  string local_6b8 [48];
  long local_688;
  byte local_679;
  long *local_670;
  string *local_668;
  char *local_660;
  undefined8 *local_658;
  string *local_650;
  char *local_648;
  string *local_640;
  char *local_638;
  undefined8 *local_630;
  string *local_628;
  char *local_620;
  undefined4 local_614;
  undefined8 *local_610;
  undefined4 local_604;
  undefined8 *local_600;
  undefined1 local_5e8 [16];
  ostream aoStack_5d8 [376];
  string *local_460;
  char *local_458;
  undefined4 local_44c;
  undefined8 *local_448;
  string *local_440;
  char *local_438;
  atomic<bool> *local_430;
  undefined1 *local_428;
  StateMachine *local_420;
  atomic<bool> *local_418;
  undefined1 *local_410;
  StateMachine *local_408;
  atomic<bool> *local_400;
  undefined1 *local_3f8;
  string *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  StateMachine *local_3d8;
  string *local_3d0;
  undefined1 *local_3c8;
  StateMachine *local_3c0;
  string *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  StateMachine *local_398;
  char *local_390;
  undefined1 *local_388;
  string *local_380;
  char *local_378;
  string *local_370;
  char *local_368;
  undefined4 local_35c;
  undefined8 *local_358;
  undefined4 local_34c;
  undefined8 *local_348;
  undefined1 local_330 [16];
  ostream aoStack_320 [376];
  string *local_1a8;
  char *local_1a0;
  string *local_198;
  char *local_190;
  undefined4 local_184;
  undefined8 *local_180;
  string *local_178;
  char *local_170;
  string *local_168;
  char *local_160;
  undefined *local_158;
  undefined1 *local_150;
  undefined8 *local_148;
  undefined *local_140;
  undefined1 *local_138;
  undefined8 *local_130;
  undefined *local_128;
  undefined1 *local_120;
  string *local_118;
  char *local_110;
  string *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined8 *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined8 *local_d8;
  string *local_d0;
  char *local_c8;
  string *local_c0;
  undefined1 *local_b8;
  LogStringBuffer *local_b0;
  string *local_a8;
  undefined1 *local_a0;
  LogStringBuffer *local_98;
  string *local_90;
  undefined1 *local_88;
  char *local_80;
  undefined1 *local_78;
  string *local_70;
  char *local_68;
  undefined1 *local_60;
  LogStringBuffer *local_58;
  string *local_50;
  undefined1 *local_48;
  LogStringBuffer *local_40;
  string *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  LogStringBuffer *local_18;
  char *local_10;
  undefined1 *local_8;
  
  local_679 = 0;
  UpdateLANInfo(in_stack_fffffffffffff898,in_stack_fffffffffffff890);
  local_670 = &local_688;
  if (local_688 != 0) {
    Result::ToJson_abi_cxx11_((Result *)in_stack_fffffffffffff848);
    local_658 = &ModuleLogger;
    local_660 = "Could not get LAN info: ";
    local_668 = local_6b8;
    local_610 = &ModuleLogger;
    local_614 = 3;
    local_620 = "Could not get LAN info: ";
    local_600 = &ModuleLogger;
    local_604 = 3;
    local_628 = local_668;
    if (DAT_002b61e8 < 4) {
      local_448 = &ModuleLogger;
      local_44c = 3;
      local_458 = "Could not get LAN info: ";
      pSVar4 = (StateMachine *)&ModuleLogger;
      local_460 = local_668;
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_fffffffffffff820,
                 (char *)CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818),Trace);
      local_430 = &pSVar4->API_Requests_Updated;
      local_428 = local_5e8;
      local_438 = local_458;
      local_440 = local_460;
      in_stack_fffffffffffff8b0 = pSVar4;
      local_420 = pSVar4;
      local_418 = local_430;
      local_410 = local_428;
      local_408 = pSVar4;
      local_400 = local_430;
      local_3f8 = local_428;
      std::operator<<(aoStack_5d8,(string *)local_430);
      local_3e0 = local_428;
      local_3e8 = local_438;
      local_3f0 = local_440;
      local_3a0 = local_428;
      local_3a8 = local_438;
      local_388 = local_428;
      local_390 = local_438;
      local_3d8 = pSVar4;
      local_398 = pSVar4;
      std::operator<<((ostream *)(local_428 + 0x10),local_438);
      local_3c8 = local_3e0;
      local_3d0 = local_3f0;
      local_3b0 = local_3e0;
      local_3b8 = local_3f0;
      local_3c0 = pSVar4;
      std::operator<<((ostream *)(local_3e0 + 0x10),local_3f0);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x19c9a2);
    }
    std::__cxx11::string::~string(local_6b8);
  }
  if ((local_679 & 1) == 0) {
    local_6bc = 1;
  }
  else {
    bVar1 = asio::ip::address::is_unspecified((address *)in_stack_fffffffffffff820);
    in_RDI->HaveSeenAGatewayAddress = (bool)((in_RDI->HaveSeenAGatewayAddress | ~bVar1) & 1);
    asio::ip::address::to_string_abi_cxx11_(in_stack_fffffffffffff828);
    asio::ip::address::to_string_abi_cxx11_(in_stack_fffffffffffff828);
    local_630 = &ModuleLogger;
    local_638 = "Detected new LAN configuration. Gateway: ";
    local_640 = local_6e0;
    local_648 = " LocalIP: ";
    local_650 = (string *)(local_710 + 0x10);
    local_358 = &ModuleLogger;
    local_35c = 2;
    local_368 = "Detected new LAN configuration. Gateway: ";
    local_378 = " LocalIP: ";
    local_348 = &ModuleLogger;
    local_34c = 2;
    local_380 = local_650;
    local_370 = local_640;
    if (DAT_002b61e8 < 3) {
      local_180 = &ModuleLogger;
      local_184 = 2;
      local_190 = "Detected new LAN configuration. Gateway: ";
      local_1a0 = " LocalIP: ";
      local_1a8 = local_650;
      local_198 = local_640;
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_fffffffffffff820,
                 (char *)CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818),Trace);
      local_158 = &DAT_002b6218;
      local_148 = &ModuleLogger;
      local_150 = local_330;
      local_160 = local_190;
      local_168 = local_198;
      local_170 = local_1a0;
      local_178 = local_1a8;
      local_130 = &ModuleLogger;
      local_140 = local_158;
      local_138 = local_150;
      local_128 = local_158;
      local_120 = local_150;
      std::operator<<(aoStack_320,(string *)&DAT_002b6218);
      local_f0 = &ModuleLogger;
      local_f8 = local_150;
      local_100 = local_160;
      local_108 = local_168;
      local_110 = local_170;
      local_118 = local_178;
      pLVar3 = (LogStringBuffer *)&ModuleLogger;
      local_d8 = &ModuleLogger;
      local_e0 = local_150;
      local_e8 = local_160;
      local_78 = local_150;
      local_80 = local_160;
      std::operator<<((ostream *)(local_150 + 0x10),local_160);
      local_b8 = local_f8;
      local_c0 = local_108;
      local_c8 = local_110;
      local_d0 = local_118;
      local_a0 = local_f8;
      local_a8 = local_108;
      local_88 = local_f8;
      local_90 = local_108;
      this_00 = pLVar3;
      local_b0 = pLVar3;
      local_98 = pLVar3;
      std::operator<<((ostream *)(local_f8 + 0x10),local_108);
      local_60 = local_b8;
      local_68 = local_c8;
      local_70 = local_d0;
      local_20 = local_b8;
      local_28 = local_c8;
      local_8 = local_b8;
      local_10 = local_c8;
      buffer_00 = pLVar3;
      local_58 = pLVar3;
      local_18 = pLVar3;
      std::operator<<((ostream *)(local_b8 + 0x10),local_c8);
      local_48 = local_60;
      local_50 = local_70;
      local_30 = local_60;
      local_38 = local_70;
      local_40 = pLVar3;
      std::operator<<((ostream *)(local_60 + 0x10),local_70);
      in_stack_fffffffffffff848 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write((OutputWorker *)this_00,buffer_00);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x19cfdb);
    }
    std::__cxx11::string::~string((string *)(local_710 + 0x10));
    std::__cxx11::string::~string(local_6e0);
    uVar2 = IsNetworkDefinitelyDown
                      ((SSDPRequester *)
                       CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818));
    if ((bool)uVar2) {
      local_6bc = 1;
    }
    else {
      __args = (address *)local_710;
      std::error_code::error_code((error_code *)in_stack_fffffffffffff820);
      asio::ip::make_address((char *)in_stack_fffffffffffff848,in_stack_fffffffffffff840);
      in_stack_fffffffffffff820 = (LogStringBuffer *)&in_RDI->SSDPAddresses;
      std::
      vector<asio::ip::basic_endpoint<asio::ip::udp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::udp>_>_>
      ::clear((vector<asio::ip::basic_endpoint<asio::ip::udp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::udp>_>_>
               *)0x19d0cb);
      std::
      vector<asio::ip::basic_endpoint<asio::ip::udp>,std::allocator<asio::ip::basic_endpoint<asio::ip::udp>>>
      ::emplace_back<asio::ip::address_const&,unsigned_short_const&>
                ((vector<asio::ip::basic_endpoint<asio::ip::udp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::udp>_>_>
                  *)CONCAT17(uVar2,in_stack_fffffffffffff830),__args,
                 (unsigned_short *)in_stack_fffffffffffff820);
      bVar1 = asio::ip::address::is_unspecified((address *)in_stack_fffffffffffff820);
      if (!bVar1) {
        std::
        vector<asio::ip::basic_endpoint<asio::ip::udp>,std::allocator<asio::ip::basic_endpoint<asio::ip::udp>>>
        ::emplace_back<asio::ip::address&,unsigned_short_const&>
                  ((vector<asio::ip::basic_endpoint<asio::ip::udp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::udp>_>_>
                    *)CONCAT17(uVar2,in_stack_fffffffffffff830),__args,
                   (unsigned_short *)in_stack_fffffffffffff820);
      }
      BeginSearch(in_RDI);
      StateMachine::OnLANChange(in_stack_fffffffffffff8b0);
      local_6bc = 0;
    }
  }
  Result::~Result((Result *)in_stack_fffffffffffff820);
  return;
}

Assistant:

void SSDPRequester::PollLANInfo()
{
    bool updated = false;
    Result lanResult = UpdateLANInfo(LAN, updated);
    if (lanResult.IsFail()) {
        ModuleLogger.Warning("Could not get LAN info: ", lanResult.ToJson());
    }
    if (!updated) {
        return;
    }
    HaveSeenAGatewayAddress |= !LAN.Gateway.is_unspecified();

    ModuleLogger.Info("Detected new LAN configuration. Gateway: ", LAN.Gateway.to_string(),
        " LocalIP: ", LAN.Localhost.to_string());

    // If network is not possibly up
    if (IsNetworkDefinitelyDown()) {
        return;
    }

    // Convert IP string to IP address
    asio::error_code ec;
    const asio::ip::address multicastIP = \
        asio::ip::make_address(kUPnPMulticastAddress, ec);
    TONK_DEBUG_ASSERT(!ec); // Should never happen

    // Send to multicast address
    SSDPAddresses.clear();
    SSDPAddresses.emplace_back(multicastIP, kPortSSDP);

    // If we were able to get the LAN gateway address:
    if (!LAN.Gateway.is_unspecified()) {
        SSDPAddresses.emplace_back(LAN.Gateway, kPortSSDP);
    }

    // Restart SSDP scanning
    BeginSearch();

    // Allow state machine to react to LAN change
    State->OnLANChange();
}